

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Functional::Tex2DCompletenessCase::iterate(Tex2DCompletenessCase *this)

{
  TestLog *log;
  RenderContext *context;
  bool bVar1;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Surface *result;
  char *description;
  uint y;
  uint x;
  CompareLogMode logMode;
  RGBA color;
  int height;
  vector<float,_std::allocator<float>_> texCoord;
  Surface renderedFrame;
  Random random;
  TextureRenderer renderer;
  TextureFormat local_100;
  vector<float,_std::allocator<float>_> local_f8;
  Surface local_d8;
  deRandom local_c0;
  PixelBufferAccess local_b0;
  TextureRenderer local_88;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar2 = *(int *)CONCAT44(extraout_var,iVar2);
  if (0x3f < iVar2) {
    iVar2 = 0x40;
  }
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)(CONCAT44(extraout_var_00,iVar3) + 4);
  height = 0x40;
  if (iVar3 < 0x40) {
    height = iVar3;
  }
  log = this->m_testCtx->m_log;
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&local_88,this->m_renderCtx,log,GLSL_VERSION_100_ES,PRECISION_MEDIUMP);
  tcu::Surface::Surface(&local_d8,iVar2,height);
  local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dVar4 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_c0,dVar4);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)CONCAT44(extraout_var_01,iVar3);
  dVar4 = deRandom_getUint32(&local_c0);
  x = dVar4 % ((iVar3 - iVar2) + 1U);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)(CONCAT44(extraout_var_02,iVar3) + 4);
  dVar4 = deRandom_getUint32(&local_c0);
  y = dVar4 % ((iVar3 - height) + 1U);
  local_b0.super_ConstPixelBufferAccess.m_format.order = R;
  local_b0.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  local_100 = (TextureFormat)&DAT_3f8000003f800000;
  glu::TextureTestUtil::computeQuadTexCoord2D(&local_f8,(Vec2 *)&local_b0,(Vec2 *)&local_100);
  glwViewport(x,y,iVar2,height);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&local_88,0,
             local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,TEXTURETYPE_2D);
  context = this->m_renderCtx;
  local_100.order = RGBA;
  local_100.type = UNORM_INT8;
  if ((void *)local_d8.m_pixels.m_cap != (void *)0x0) {
    local_d8.m_pixels.m_cap = (size_t)local_d8.m_pixels.m_ptr;
  }
  logMode = COMPARE_LOG_RESULT;
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_b0,&local_100,local_d8.m_width,local_d8.m_height,1,
             (void *)local_d8.m_pixels.m_cap);
  color.m_value = (deUint32)local_d8.m_pixels.m_cap;
  result = (Surface *)&local_b0;
  glu::readPixels(context,x,y,(PixelBufferAccess *)result);
  bVar1 = compareToConstantColor
                    (log,(char *)&local_d8,(char *)(ulong)(this->m_compareColor).m_value,result,
                     logMode,color);
  description = "Image comparison failed";
  if (bVar1) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult(this->m_testCtx,(uint)!bVar1,description);
  if (local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_d8);
  deqp::gls::TextureTestUtil::TextureRenderer::~TextureRenderer(&local_88);
  return STOP;
}

Assistant:

Tex2DCompletenessCase::IterateResult Tex2DCompletenessCase::iterate (void)
{
	int					viewportWidth	= de::min(64, m_renderCtx.getRenderTarget().getWidth());
	int					viewportHeight	= de::min(64, m_renderCtx.getRenderTarget().getHeight());
	TestLog&			log				= m_testCtx.getLog();
	TextureRenderer		renderer		(m_renderCtx, log, glu::GLSL_VERSION_100_ES, glu::PRECISION_MEDIUMP);
	tcu::Surface		renderedFrame	(viewportWidth, viewportHeight);
	vector<float>		texCoord;

	de::Random			random			(deStringHash(getName()));
	int					offsetX			= random.getInt(0, m_renderCtx.getRenderTarget().getWidth()		- viewportWidth	);
	int					offsetY			= random.getInt(0, m_renderCtx.getRenderTarget().getHeight()	- viewportHeight);

	computeQuadTexCoord2D	(texCoord, tcu::Vec2(0.0f, 0.0f), tcu::Vec2(1.0f, 1.0f));

	glViewport				(offsetX, offsetY, viewportWidth, viewportHeight);

	createTexture			();
	renderer.renderQuad		(0, &texCoord[0], glu::TextureTestUtil::TEXTURETYPE_2D);
	glu::readPixels			(m_renderCtx, offsetX, offsetY, renderedFrame.getAccess());

	bool isOk = compareToConstantColor(log, "Result", "Image comparison result", renderedFrame, tcu::COMPARE_LOG_RESULT, m_compareColor);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Image comparison failed");
	return STOP;
}